

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,matrix2f *m)

{
  ostream *poVar1;
  char *pcVar2;
  _anonymous_namespace_ *p_Var3;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  matrix2f *local_18;
  matrix2f *m_local;
  ostream *ofs_local;
  
  local_18 = m;
  m_local = (matrix2f *)ofs;
  std::operator<<(ofs,"( ");
  pcVar2 = "(";
  poVar1 = std::operator<<((ostream *)m_local,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)pcVar2,local_18->m[0][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_58,p_Var3,local_18->m[0][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::operator<<(poVar1,"), ");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar2 = "(";
  poVar1 = std::operator<<((ostream *)m_local,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)pcVar2,local_18->m[1][0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  p_Var3 = (_anonymous_namespace_ *)0x59dfed;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_98,p_Var3,local_18->m[1][1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator<<((ostream *)m_local," )");
  return (ostream *)m_local;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::matrix2f &m) {
  ofs << "( ";

  ofs << "(" << tinyusdz::dtos(m.m[0][0]) << ", " << tinyusdz::dtos(m.m[0][1])
      << "), ";
  ofs << "(" << tinyusdz::dtos(m.m[1][0]) << ", " << tinyusdz::dtos(m.m[1][1])
      << ")";

  ofs << " )";

  return ofs;
}